

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O0

bool read_xpm_string(QByteArray *buf,QIODevice *d,char **source,int *index,QByteArray *state)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  QByteArray *this;
  QByteArray *pQVar5;
  long lVar6;
  int *in_RCX;
  long in_RDX;
  char *in_RSI;
  QByteArray *in_RDI;
  QByteArray *in_R8;
  long in_FS_OFFSET;
  char c;
  qint64 bytesRead;
  int offset;
  bool gotQuote;
  char buf_1 [2048];
  undefined7 in_stack_fffffffffffff788;
  char in_stack_fffffffffffff78f;
  int local_858;
  bool local_821;
  QByteArray local_820;
  char local_808 [2048];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    QByteArray::operator=(in_RDI,"");
    bVar2 = false;
    local_858 = 0;
    do {
      this = (QByteArray *)(long)local_858;
      pQVar5 = (QByteArray *)QByteArray::size(in_R8);
      if ((this == pQVar5) || (bVar3 = QByteArray::isEmpty((QByteArray *)0x3379c0), bVar3)) {
        memset(local_808,0xaa,0x800);
        lVar6 = QIODevice::read(in_RSI,(longlong)local_808);
        if (lVar6 < 1) {
          local_821 = false;
          goto LAB_00337ac5;
        }
        QByteArray::QByteArray(&local_820,local_808,(long)(int)lVar6);
        QByteArray::operator=
                  (this,(QByteArray *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788))
        ;
        QByteArray::~QByteArray((QByteArray *)0x337a35);
        local_858 = 0;
      }
      if (bVar2) {
        cVar4 = QByteArray::at((QByteArray *)
                               CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
                               0x337a87);
        if (cVar4 == '\"') goto LAB_00337aad;
        QByteArray::operator+=(this,in_stack_fffffffffffff78f);
      }
      else {
        cVar4 = QByteArray::at((QByteArray *)
                               CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788),
                               0x337a5e);
        if (cVar4 == '\"') {
          bVar2 = true;
        }
      }
      local_858 = local_858 + 1;
    } while( true );
  }
  iVar1 = *in_RCX;
  *in_RCX = iVar1 + 1;
  QByteArray::operator=(in_RDI,*(char **)(in_RDX + (long)iVar1 * 8));
  local_821 = true;
LAB_00337ac5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_821;
LAB_00337aad:
  QByteArray::remove((longlong)in_R8,0);
  local_821 = true;
  goto LAB_00337ac5;
}

Assistant:

static bool read_xpm_string(QByteArray &buf, QIODevice *d, const char * const *source, int &index,
                            QByteArray &state)
{
    if (source) {
        buf = source[index++];
        return true;
    }

    buf = "";
    bool gotQuote = false;
    int offset = 0;
    forever {
        if (offset == state.size() || state.isEmpty()) {
            char buf[2048];
            qint64 bytesRead = d->read(buf, sizeof(buf));
            if (bytesRead <= 0)
                return false;
            state = QByteArray(buf, int(bytesRead));
            offset = 0;
        }

        if (!gotQuote) {
            if (state.at(offset++) == '"')
                gotQuote = true;
        } else {
            char c = state.at(offset++);
            if (c == '"')
                break;
            buf += c;
        }
    }
    state.remove(0, offset);
    return true;
}